

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseValueType(WastParser *this,Var *out_type)

{
  Enum index;
  bool bVar1;
  TokenType TVar2;
  Result RVar3;
  long lVar4;
  long *plVar5;
  Type type;
  Token token;
  Type local_190;
  size_t local_188;
  char *pcStack_180;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_178;
  undefined8 uStack_170;
  undefined1 local_168 [32];
  undefined1 *local_148;
  undefined1 local_138 [16];
  string local_128 [16];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  long *local_a8 [2];
  long local_98 [2];
  Token local_88;
  Location local_48;
  
  if ((this->options_->features).function_references_enabled_ == true) {
    bVar1 = PeekMatchLpar(this,Ref);
  }
  else {
    bVar1 = false;
  }
  TVar2 = Peek(this,0);
  if ((bVar1 == false) && (TVar2 != First_Type)) {
    local_168._0_8_ = local_168 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"i32","");
    local_148 = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"i64","");
    local_128._0_8_ = local_118;
    std::__cxx11::string::_M_construct<char_const*>(local_128,"f32","");
    local_108[0] = local_f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"f64","");
    local_e8[0] = local_d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"v128","");
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"externref","");
    plVar5 = local_98;
    local_a8[0] = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"funcref","");
    local_88.loc.filename._M_len = 0;
    local_88.loc.filename._M_str = (char *)0x0;
    local_88.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
               (string *)local_168,&local_88);
    RVar3 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_88,(char *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_88);
    lVar4 = -0xe0;
    do {
      if (plVar5 != (long *)plVar5[-2]) {
        operator_delete((long *)plVar5[-2],*plVar5 + 1);
      }
      plVar5 = plVar5 + -4;
      lVar4 = lVar4 + 0x20;
    } while (lVar4 != 0);
    return (Result)RVar3.enum_;
  }
  if (bVar1 != false) {
    RVar3 = Expect(this,Lpar);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    RVar3 = Expect(this,Ref);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    RVar3 = ParseVar(this,out_type);
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    RVar3 = Expect(this,Rpar);
    return (Result)(uint)(RVar3.enum_ == Error);
  }
  Consume(&local_88,this);
  if ((local_88.token_type_ & ~AssertExhaustion) != First_Type) {
    __assert_fail("HasType()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/token.h"
                  ,0x68,"Type wabt::Token::type() const");
  }
  local_190.enum_ = local_88.field_2.type_.enum_;
  local_190.type_index_ = local_88.field_2.type_.type_index_;
  index = local_88.field_2.type_.enum_;
  if ((uint)(index + 0x11) < 2) {
    lVar4 = 10;
  }
  else {
    lVar4 = 4;
    if (index != V128) goto LAB_001942e3;
  }
  if ((&(this->options_->features).exceptions_enabled_)[lVar4] == false) {
    local_178.offset = (size_t)local_88.loc.field_1.field_1.offset;
    uStack_170 = local_88.loc.field_1._8_8_;
    local_188 = local_88.loc.filename._M_len;
    pcStack_180 = local_88.loc.filename._M_str;
    Type::GetName_abi_cxx11_((string *)local_168,&local_190);
    Error(this,0x1fd14a,(char *)local_168._0_8_);
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_,local_168._16_8_ + 1);
    }
    return (Result)Error;
  }
LAB_001942e3:
  GetToken((Token *)local_168,this);
  local_48.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_168._16_8_;
  local_48.field_1._8_8_ = local_168._24_8_;
  local_48.filename._M_len = local_168._0_8_;
  local_48.filename._M_str = (char *)local_168._8_8_;
  Var::Var((Var *)local_168,index,&local_48);
  Var::operator=(out_type,(Var *)local_168);
  Var::~Var((Var *)local_168);
  return (Result)Ok;
}

Assistant:

Result WastParser::ParseValueType(Var* out_type) {
  WABT_TRACE(ParseValueType);

  const bool is_ref_type = PeekMatchRefType();
  const bool is_value_type = PeekMatch(TokenType::ValueType);

  if (!is_value_type && !is_ref_type) {
    return ErrorExpected(
        {"i32", "i64", "f32", "f64", "v128", "externref", "funcref"});
  }

  if (is_ref_type) {
    EXPECT(Lpar);
    EXPECT(Ref);
    CHECK_RESULT(ParseVar(out_type));
    EXPECT(Rpar);
    return Result::Ok;
  }

  Token token = Consume();
  Type type = token.type();
  bool is_enabled;
  switch (type) {
    case Type::V128:
      is_enabled = options_->features.simd_enabled();
      break;
    case Type::FuncRef:
    case Type::ExternRef:
      is_enabled = options_->features.reference_types_enabled();
      break;
    default:
      is_enabled = true;
      break;
  }

  if (!is_enabled) {
    Error(token.loc, "value type not allowed: %s", type.GetName().c_str());
    return Result::Error;
  }

  *out_type = Var(type, GetLocation());
  return Result::Ok;
}